

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O0

void duckdb::UDFWrapper::RegisterFunction<long,long,long>
               (string *name,scalar_function_t *udf_function,ClientContext *context,
               LogicalType *varargs)

{
  LogicalType *in_RCX;
  undefined8 in_RDX;
  string *in_RDI;
  LogicalType ret_type;
  vector<duckdb::LogicalType,_true> arguments;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffee8;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *__x;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffef0;
  LogicalType local_e8 [8];
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff20;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_d0;
  LogicalType local_b0 [24];
  undefined1 local_98 [24];
  string local_80 [32];
  LogicalType local_60 [72];
  undefined8 local_18;
  string *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x4e10d3);
  GetArgumentTypesRecursive<long,long>(in_stack_ffffffffffffff20);
  GetArgumentType<long>();
  std::__cxx11::string::string(local_80,local_8);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  duckdb::LogicalType::LogicalType(local_b0,local_60);
  __x = &local_d0;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (in_stack_fffffffffffffef0,__x);
  duckdb::LogicalType::LogicalType(local_e8,in_RCX);
  duckdb::UDFWrapper::RegisterFunction(local_80,local_98,local_b0,__x,local_18,local_e8);
  duckdb::LogicalType::~LogicalType(local_e8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x4e11a2);
  duckdb::LogicalType::~LogicalType(local_b0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x4e11b9);
  std::__cxx11::string::~string(local_80);
  duckdb::LogicalType::~LogicalType(local_60);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x4e11e0);
  return;
}

Assistant:

inline static void RegisterFunction(const string &name, scalar_function_t udf_function, ClientContext &context,
	                                    LogicalType varargs = LogicalType(LogicalTypeId::INVALID)) {
		vector<LogicalType> arguments;
		GetArgumentTypesRecursive<ARGS...>(arguments);

		LogicalType ret_type = GetArgumentType<TR>();

		RegisterFunction(name, arguments, ret_type, std::move(udf_function), context, std::move(varargs));
	}